

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testGroupEnded
          (StreamingReporterBase<Catch::CompactReporter> *this,TestGroupStats *param_2)

{
  LazyStat<Catch::GroupInfo> *in_RSI;
  
  LazyStat<Catch::GroupInfo>::reset(in_RSI);
  return;
}

Assistant:

void testGroupEnded(TestGroupStats const& /* _testGroupStats */) override {
            currentGroupInfo.reset();
        }